

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_bias_test.cc
# Opt level: O0

void intgemm::kernel_add_bias_test<(intgemm::CPUType)1,short>(void)

{
  vector_t<CPUType::SSE2,_int> input_00;
  StringRef capturedExpression;
  short *__first;
  short *__last;
  longlong (*palVar1) [2];
  AssertionHandler *pAVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<short> output;
  AlignedVector<short> bias;
  AlignedVector<short> input;
  ExprLhs<const_short_&> in_stack_fffffffffffffe68;
  AssertionHandler *in_stack_fffffffffffffe70;
  int16_t *in_stack_fffffffffffffe78;
  SourceLineInfo *this;
  AlignedVector<short> *in_stack_fffffffffffffe80;
  AssertionHandler *this_00;
  longlong in_stack_fffffffffffffe88;
  undefined4 uVar3;
  undefined4 uVar4;
  ExprLhs<const_short_&> *this_01;
  SourceLineInfo local_b8;
  StringRef local_a8;
  AssertionHandler *local_50;
  undefined2 local_42;
  AlignedVector<short> local_40 [2];
  AlignedVector<short> local_20;
  AlignedVector<short> local_10;
  
  if (0 < kCPU) {
    AlignedVector<short>::AlignedVector
              (in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
               (size_t)in_stack_fffffffffffffe70);
    AlignedVector<short>::AlignedVector
              (in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
               (size_t)in_stack_fffffffffffffe70);
    AlignedVector<short>::AlignedVector
              (in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
               (size_t)in_stack_fffffffffffffe70);
    __first = AlignedVector<short>::begin(&local_10);
    __last = AlignedVector<short>::end(&local_10);
    std::iota<short*,short>(__first,__last,0);
    AlignedVector<short>::begin(&local_20);
    AlignedVector<short>::end(&local_20);
    local_42 = 100;
    std::fill<short*,short>
              ((short *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68.m_lhs,(short *)0x25fa0b)
    ;
    palVar1 = AlignedVector<short>::as<long_long__vector(2)>(&local_10);
    this_01 = (ExprLhs<const_short_&> *)(*palVar1)[0];
    AlignedVector<short>::begin(&local_20);
    input_00[1] = in_stack_fffffffffffffe88;
    input_00[0] = (longlong)in_stack_fffffffffffffe80;
    kernels::add_bias(input_00,in_stack_fffffffffffffe78,
                      (Index)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    uVar3 = extraout_XMM0_Dc;
    uVar4 = extraout_XMM0_Dd;
    palVar1 = AlignedVector<short>::as<long_long__vector(2)>(local_40);
    (*palVar1)[0] = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (*palVar1)[1] = CONCAT44(uVar4,uVar3);
    local_50 = (AssertionHandler *)0x0;
    while (this_00 = local_50, pAVar2 = (AssertionHandler *)AlignedVector<short>::size(local_40),
          this_00 < pAVar2) {
      local_a8 = operator____catch_sr
                           ((char *)in_stack_fffffffffffffe70,
                            (size_t)in_stack_fffffffffffffe68.m_lhs);
      this = &local_b8;
      Catch::SourceLineInfo::SourceLineInfo
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/add_bias_test.cc"
                 ,0x1d);
      Catch::StringRef::StringRef((StringRef *)this_00,(char *)this);
      capturedExpression.m_size = (size_type)palVar1;
      capturedExpression.m_start = (char *)pAVar2;
      Catch::AssertionHandler::AssertionHandler
                (this_00,(StringRef *)this,(SourceLineInfo *)in_stack_fffffffffffffe70,
                 capturedExpression,(Flags)((ulong)in_stack_fffffffffffffe68.m_lhs >> 0x20));
      in_stack_fffffffffffffe70 =
           (AssertionHandler *)AlignedVector<short>::operator[](local_40,(size_t)local_50);
      in_stack_fffffffffffffe68 =
           Catch::Decomposer::operator<=(in_stack_fffffffffffffe68.m_lhs,(short *)0x25fb71);
      Catch::ExprLhs<short_const&>::operator==(this_01,(short *)CONCAT44(uVar4,uVar3));
      Catch::AssertionHandler::handleExpr
                (in_stack_fffffffffffffe70,(ITransientExpression *)in_stack_fffffffffffffe68.m_lhs);
      Catch::BinaryExpr<const_short_&,_const_short_&>::~BinaryExpr
                ((BinaryExpr<const_short_&,_const_short_&> *)0x25fbd8);
      Catch::AssertionHandler::complete(in_stack_fffffffffffffe70);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe70);
      local_50 = (AssertionHandler *)((long)&(local_50->m_assertionInfo).macroName.m_start + 1);
    }
    AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x25fd0c);
    AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x25fd19);
    AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x25fd26);
  }
  return;
}

Assistant:

void kernel_add_bias_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static auto VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> bias(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));
  std::fill(bias.begin(), bias.end(), static_cast<ElemType_>(100));

  *output.template as<vec_t>() = kernels::add_bias(*input.template as<vec_t>(), bias.begin(), 0);
  for (std::size_t i = 0; i < output.size(); ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == static_cast<ElemType_>(bias[i] + input[i])); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(100 + i));
#endif
}